

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_table_column_metadata
              (sqlite3 *db,char *zDbName,char *zTableName,char *zColumnName,char **pzDataType,
              char **pzCollSeq,int *pNotNull,int *pPrimaryKey,int *pAutoinc)

{
  bool bVar1;
  Column *pCVar2;
  uint uVar3;
  int iVar4;
  Table *pTVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  Column *pCVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char **local_38;
  
  local_58 = (char *)0x0;
  local_50 = zColumnName;
  local_40 = zTableName;
  local_38 = pzCollSeq;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  uVar3 = sqlite3Init(db,&local_58);
  if ((uVar3 != 0) || (pTVar5 = sqlite3FindTable(db,local_40,zDbName), pTVar5 == (Table *)0x0)) {
LAB_0012c046:
    bVar1 = false;
    pcVar8 = (char *)0x0;
    uVar10 = 0;
    uVar16 = 0;
    uVar15 = 0;
    pcVar9 = (char *)0x0;
    goto LAB_0012c05b;
  }
  if (pTVar5->pSelect == (Select *)0x0) {
    if (local_50 == (char *)0x0) {
      pCVar13 = (Column *)0x0;
      uVar10 = 0;
    }
    else {
      uVar15 = (uint)pTVar5->nCol;
      if ((int)uVar15 < 1) {
        uVar10 = 0;
        pCVar13 = (Column *)0x0;
      }
      else {
        uVar11 = 0;
        pCVar2 = pTVar5->aCol;
        do {
          pCVar13 = pCVar2;
          iVar4 = sqlite3StrICmp(pCVar13->zName,local_50);
          uVar12 = uVar11;
          if (iVar4 == 0) break;
          uVar11 = uVar11 + 1;
          pCVar2 = pCVar13 + 1;
          uVar12 = (ulong)uVar15;
        } while (uVar15 != uVar11);
        uVar10 = (uint)uVar12;
      }
      if (uVar10 == uVar15) {
        if ((pTVar5->tabFlags & 0x20) != 0) goto LAB_0012c1b4;
        iVar4 = sqlite3IsRowid(local_50);
        if (iVar4 == 0) goto LAB_0012c046;
        uVar10 = (uint)pTVar5->iPKey;
        if ((int)uVar10 < 0) {
          pCVar13 = (Column *)0x0;
        }
        else {
          pCVar13 = pTVar5->aCol + uVar10;
        }
      }
    }
    uVar15 = 0;
    bVar1 = true;
    if (pCVar13 == (Column *)0x0) {
      pcVar8 = "INTEGER";
      pcVar7 = (char *)0x0;
      bVar17 = false;
      bVar14 = 1;
    }
    else {
      bVar14 = pCVar13->colFlags;
      if ((bVar14 & 4) == 0) {
        pcVar8 = (char *)0x0;
      }
      else {
        local_48 = pCVar13->zName;
        sVar6 = strlen(local_48);
        pcVar8 = local_48 + sVar6 + 1;
      }
      uVar15 = 0;
      pcVar7 = pCVar13->zColl;
      bVar17 = pCVar13->notNull != '\0';
      bVar14 = bVar14 & 1;
      if (uVar10 == (int)pTVar5->iPKey) {
        uVar15 = pTVar5->tabFlags >> 3 & 1;
      }
    }
    uVar16 = (uint)bVar14;
    uVar10 = (uint)bVar17;
    pcVar9 = "BINARY";
    if (pcVar7 != (char *)0x0) {
      pcVar9 = pcVar7;
    }
  }
  else {
LAB_0012c1b4:
    bVar1 = false;
    pcVar8 = (char *)0x0;
    uVar10 = 0;
    uVar16 = 0;
    uVar15 = 0;
    pcVar9 = (char *)0x0;
  }
LAB_0012c05b:
  if (db->noSharedCache == '\0') {
    local_48 = (char *)CONCAT44(local_48._4_4_,uVar3);
    btreeLeaveAll(db);
    uVar3 = (uint)local_48;
  }
  if (pzDataType != (char **)0x0) {
    *pzDataType = pcVar8;
  }
  if (local_38 != (char **)0x0) {
    *local_38 = pcVar9;
  }
  if (pNotNull != (int *)0x0) {
    *pNotNull = uVar10;
  }
  if (pPrimaryKey != (int *)0x0) {
    *pPrimaryKey = uVar16;
  }
  if (pAutoinc != (int *)0x0) {
    *pAutoinc = uVar15;
  }
  if (uVar3 == 0 && !bVar1) {
    if (local_58 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_58);
    }
    local_58 = sqlite3MPrintf(db,"no such table column: %s.%s",local_40,local_50);
    uVar3 = 1;
  }
  pcVar7 = "%s";
  if (local_58 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  sqlite3ErrorWithMsg(db,uVar3,pcVar7);
  if (local_58 != (char *)0x0) {
    sqlite3DbFreeNN(db,local_58);
  }
  if ((uVar3 == 0xc0a) || (db->mallocFailed != '\0')) {
    apiOomError(db);
    uVar3 = 7;
  }
  else {
    uVar3 = uVar3 & db->errMask;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar3;
}

Assistant:

SQLITE_API int sqlite3_table_column_metadata(
  sqlite3 *db,                /* Connection handle */
  const char *zDbName,        /* Database name or NULL */
  const char *zTableName,     /* Table name */
  const char *zColumnName,    /* Column name */
  char const **pzDataType,    /* OUTPUT: Declared data type */
  char const **pzCollSeq,     /* OUTPUT: Collation sequence name */
  int *pNotNull,              /* OUTPUT: True if NOT NULL constraint exists */
  int *pPrimaryKey,           /* OUTPUT: True if column part of PK */
  int *pAutoinc               /* OUTPUT: True if column is auto-increment */
){
  int rc;
  char *zErrMsg = 0;
  Table *pTab = 0;
  Column *pCol = 0;
  int iCol = 0;
  char const *zDataType = 0;
  char const *zCollSeq = 0;
  int notnull = 0;
  int primarykey = 0;
  int autoinc = 0;


#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTableName==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Ensure the database schema has been loaded */
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  rc = sqlite3Init(db, &zErrMsg);
  if( SQLITE_OK!=rc ){
    goto error_out;
  }

  /* Locate the table in question */
  pTab = sqlite3FindTable(db, zTableName, zDbName);
  if( !pTab || pTab->pSelect ){
    pTab = 0;
    goto error_out;
  }

  /* Find the column for which info is requested */
  if( zColumnName==0 ){
    /* Query for existance of table only */
  }else{
    for(iCol=0; iCol<pTab->nCol; iCol++){
      pCol = &pTab->aCol[iCol];
      if( 0==sqlite3StrICmp(pCol->zName, zColumnName) ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      if( HasRowid(pTab) && sqlite3IsRowid(zColumnName) ){
        iCol = pTab->iPKey;
        pCol = iCol>=0 ? &pTab->aCol[iCol] : 0;
      }else{
        pTab = 0;
        goto error_out;
      }
    }
  }

  /* The following block stores the meta information that will be returned
  ** to the caller in local variables zDataType, zCollSeq, notnull, primarykey
  ** and autoinc. At this point there are two possibilities:
  ** 
  **     1. The specified column name was rowid", "oid" or "_rowid_" 
  **        and there is no explicitly declared IPK column. 
  **
  **     2. The table is not a view and the column name identified an 
  **        explicitly declared column. Copy meta information from *pCol.
  */ 
  if( pCol ){
    zDataType = sqlite3ColumnType(pCol,0);
    zCollSeq = pCol->zColl;
    notnull = pCol->notNull!=0;
    primarykey  = (pCol->colFlags & COLFLAG_PRIMKEY)!=0;
    autoinc = pTab->iPKey==iCol && (pTab->tabFlags & TF_Autoincrement)!=0;
  }else{
    zDataType = "INTEGER";
    primarykey = 1;
  }
  if( !zCollSeq ){
    zCollSeq = sqlite3StrBINARY;
  }

error_out:
  sqlite3BtreeLeaveAll(db);

  /* Whether the function call succeeded or failed, set the output parameters
  ** to whatever their local counterparts contain. If an error did occur,
  ** this has the effect of zeroing all output parameters.
  */
  if( pzDataType ) *pzDataType = zDataType;
  if( pzCollSeq ) *pzCollSeq = zCollSeq;
  if( pNotNull ) *pNotNull = notnull;
  if( pPrimaryKey ) *pPrimaryKey = primarykey;
  if( pAutoinc ) *pAutoinc = autoinc;

  if( SQLITE_OK==rc && !pTab ){
    sqlite3DbFree(db, zErrMsg);
    zErrMsg = sqlite3MPrintf(db, "no such table column: %s.%s", zTableName,
        zColumnName);
    rc = SQLITE_ERROR;
  }
  sqlite3ErrorWithMsg(db, rc, (zErrMsg?"%s":0), zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}